

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLExportTest_writePropertiesTest_Test::~OpenDDLExportTest_writePropertiesTest_Test
          (OpenDDLExportTest_writePropertiesTest_Test *this)

{
  OpenDDLExportTest_writePropertiesTest_Test *this_local;
  
  ~OpenDDLExportTest_writePropertiesTest_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writePropertiesTest) {
    OpenDDLExportMock myExporter;
    bool ok(true);
    std::string statement;
    ok = myExporter.writePropertiesTester(nullptr, statement);
    EXPECT_FALSE(ok);

    Property *prop(createProperties(1));
    m_root->setProperties(prop);

    ok = myExporter.writePropertiesTester(m_root, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("(id.0 = 0)", statement);

    statement.clear();
    Property *prop2(createProperties(2));
    m_root->setProperties(prop2);
    ok = myExporter.writePropertiesTester(m_root, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("(id.0 = 0, id.1 = 1)", statement);
}